

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O3

void __thiscall
mp::internal::
NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
::Read(NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
       *this)

{
  BinaryReader<mp::internal::EndiannessConverter> *pBVar1;
  pointer pcVar2;
  BinaryReader<mp::internal::EndiannessConverter> bound_reader;
  VarBoundHandler<mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
  bound_handler;
  NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>_>
  reader;
  undefined1 local_88 [32];
  _Alloc_hider local_68;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  VarBoundHandler<mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
  local_48;
  NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>_>
  local_38;
  
  if ((this->flags_ & 1) == 0) {
    Read(this,(BinaryReader<mp::internal::EndiannessConverter> *)0x0);
    return;
  }
  local_48.handler_ = this->handler_;
  local_48.super_NullNLHandler<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_>.
  super_NLHandler<mp::NullNLHandler<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_>,_mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_>
  ._vptr_NLHandler =
       (NLHandler<mp::NullNLHandler<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_>,_mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)71>_>
        )&PTR__NLHandler_005d4218;
  pBVar1 = this->reader_;
  local_88._0_4_ = *(undefined4 *)&(pBVar1->super_BinaryReaderBase).super_ReaderBase.ptr_;
  local_88._4_4_ =
       *(undefined4 *)((long)&(pBVar1->super_BinaryReaderBase).super_ReaderBase.ptr_ + 4);
  local_88._8_4_ = *(undefined4 *)&(pBVar1->super_BinaryReaderBase).super_ReaderBase.start_;
  local_88._12_4_ =
       *(undefined4 *)((long)&(pBVar1->super_BinaryReaderBase).super_ReaderBase.start_ + 4);
  local_88._16_4_ = *(undefined4 *)&(pBVar1->super_BinaryReaderBase).super_ReaderBase.end_;
  local_88._20_4_ =
       *(undefined4 *)((long)&(pBVar1->super_BinaryReaderBase).super_ReaderBase.end_ + 4);
  local_88._24_4_ = *(undefined4 *)&(pBVar1->super_BinaryReaderBase).super_ReaderBase.token_;
  local_88._28_4_ =
       *(undefined4 *)((long)&(pBVar1->super_BinaryReaderBase).super_ReaderBase.token_ + 4);
  pcVar2 = (pBVar1->super_BinaryReaderBase).super_ReaderBase.name_._M_dataplus._M_p;
  local_68._M_p = (pointer)&local_58;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,pcVar2,
             pcVar2 + (pBVar1->super_BinaryReaderBase).super_ReaderBase.name_._M_string_length);
  local_38.header_ = this->header_;
  local_38.flags_ = this->flags_;
  local_38.num_vars_and_exprs_ = 0;
  local_38.reader_ = (BinaryReader<mp::internal::EndiannessConverter> *)local_88;
  local_38.handler_ = &local_48;
  NLReader<mp::internal::BinaryReader<mp::internal::EndiannessConverter>,_mp::internal::VarBoundHandler<mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>_>
  ::Read(&local_38,(BinaryReader<mp::internal::EndiannessConverter> *)0x0);
  Read(this,(BinaryReader<mp::internal::EndiannessConverter> *)local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_p != &local_58) {
    operator_delete(local_68._M_p,local_58._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void NLReader<Reader, Handler>::Read() {
  if ((flags_ & READ_BOUNDS_FIRST) != 0) {
    // Read variable bounds first because this allows more efficient
    // problem construction.
    VarBoundHandler<Handler> bound_handler(handler_);
    Reader bound_reader(reader_);
    NLReader< Reader, VarBoundHandler<Handler> >
        reader(bound_reader, header_, bound_handler, flags_);
    reader.Read(0);
    // Read everything else.
    Read(&bound_reader);
  } else {
    Read(0);
  }
  handler_.EndInput();
}